

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::visitContinueStatement
          (CheckerVisitor *this,ContinueStatement *continueStmt)

{
  BreakableScope *pBVar1;
  BreakableScope **ppBVar2;
  
  ppBVar2 = &this->breakScope;
  do {
    pBVar1 = *ppBVar2;
    ppBVar2 = &pBVar1->parent;
  } while (pBVar1->kind != BSK_LOOP);
  VarScope::mergeUnbalanced(pBVar1->loopScope,this->currentScope);
  return;
}

Assistant:

void CheckerVisitor::visitContinueStatement(ContinueStatement *continueStmt) {
  VarScope *trunkScope = currentScope;
  BreakableScope *bs = breakScope;
  assert(bs);

  while (bs->kind != BSK_LOOP)
    bs = bs->parent;

  assert(bs->loopScope);

  bs->loopScope->mergeUnbalanced(trunkScope);
}